

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void remove_expired(CookieInfo *cookies)

{
  Cookie *pCVar1;
  time_t tVar2;
  curl_off_t now;
  Cookie *pv;
  Cookie *nx;
  Cookie *co;
  CookieInfo *cookies_local;
  
  tVar2 = time((time_t *)0x0);
  now = 0;
  nx = cookies->cookies;
  while (nx != (Cookie *)0x0) {
    pCVar1 = nx->next;
    if ((nx->expires == 0) || (tVar2 <= nx->expires)) {
      now = (curl_off_t)nx;
      nx = pCVar1;
    }
    else {
      if (now == 0) {
        cookies->cookies = nx->next;
      }
      else {
        *(Cookie **)now = nx->next;
      }
      cookies->numcookies = cookies->numcookies + -1;
      freecookie(nx);
      nx = pCVar1;
    }
  }
  return;
}

Assistant:

static void remove_expired(struct CookieInfo *cookies)
{
  struct Cookie *co, *nx, *pv;
  curl_off_t now = (curl_off_t)time(NULL);

  co = cookies->cookies;
  pv = NULL;
  while(co) {
    nx = co->next;
    if(co->expires && co->expires < now) {
      if(!pv) {
        cookies->cookies = co->next;
      }
      else {
        pv->next = co->next;
      }
      cookies->numcookies--;
      freecookie(co);
    }
    else {
      pv = co;
    }
    co = nx;
  }
}